

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

TypeId __thiscall
Js::JavascriptNativeIntArray::TrySetNativeIntArrayItem
          (JavascriptNativeIntArray *this,Var value,int32 *iValue,double *dValue)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  TypeId local_38;
  bool local_31;
  int32 i;
  bool isInt32;
  
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b7fa84;
    *puVar3 = 0;
  }
  if (((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)value & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00b7fa84:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if ((int)value != -0x7fffe) {
      *iValue = (int)value;
      return TypeIds_NativeIntArray;
    }
    goto LAB_00b7fa68;
  }
  if ((ulong)value >> 0x32 == 0) goto LAB_00b7fa68;
  bVar2 = JavascriptNumber::TryGetInt32OrUInt32Value
                    ((double)((ulong)value ^ 0xfffc000000000000),(int32 *)&local_38,&local_31);
  if (bVar2) {
    if ((local_38 != 0xfff80002 & local_31) == 1) {
      *iValue = local_38;
      local_38 = TypeIds_NativeIntArray;
      goto LAB_00b7fa5e;
    }
    bVar2 = true;
  }
  else {
    *dValue = (double)((ulong)value ^ 0xfffc000000000000);
    ToNativeFloatArray(this);
    local_38 = TypeIds_ArrayLast;
LAB_00b7fa5e:
    bVar2 = false;
  }
  if (!bVar2) {
    return local_38;
  }
LAB_00b7fa68:
  ToVarArray(this);
  return TypeIds_Array;
}

Assistant:

TypeId JavascriptNativeIntArray::TrySetNativeIntArrayItem(Var value, int32 *iValue, double *dValue)
    {
        if (TaggedInt::Is(value))
        {
            int32 i = TaggedInt::ToInt32(value);
            if (i != JavascriptNativeIntArray::MissingItem)
            {
                *iValue = i;
                return TypeIds_NativeIntArray;
            }
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(value))
        {
            bool isInt32;
            int32 i;
            double d = JavascriptNumber::GetValue(value);
            if (JavascriptNumber::TryGetInt32OrUInt32Value(d, &i, &isInt32))
            {
                if (isInt32 && i != JavascriptNativeIntArray::MissingItem)
                {
                    *iValue = i;
                    return TypeIds_NativeIntArray;
                }
            }
            else
            {
                *dValue = d;
                JavascriptNativeIntArray::ToNativeFloatArray(this);
                return TypeIds_NativeFloatArray;
            }
        }

        JavascriptNativeIntArray::ToVarArray(this);
        return TypeIds_Array;
    }